

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

shared_ptr<Instance> get_shared_instance(string *type,string *value)

{
  pointer pcVar1;
  int iVar2;
  Instance *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<Instance> sVar6;
  undefined1 local_39;
  pointer local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  (type->_M_dataplus)._M_p = (pointer)0x0;
  type->_M_string_length = 0;
  iVar2 = std::__cxx11::string::compare((char *)value);
  if (iVar2 == 0) {
    std::__shared_ptr<BooleanInstance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<BooleanInstance>,std::__cxx11::string_const&>
              ((__shared_ptr<BooleanInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<BooleanInstance> *)&local_39,in_RDX);
    (type->_M_dataplus)._M_p = local_38;
    type->_M_string_length = (size_type)p_Stack_30;
    p_Var5 = p_Stack_30;
  }
  else {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  iVar2 = std::__cxx11::string::compare((char *)value);
  p_Var4 = p_Var5;
  if (iVar2 == 0) {
    std::__shared_ptr<CharacterInstance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<CharacterInstance>,std::__cxx11::string_const&>
              ((__shared_ptr<CharacterInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<CharacterInstance> *)&local_39,in_RDX);
    p_Var4 = p_Stack_30;
    pcVar1 = local_38;
    local_38 = (pointer)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (type->_M_dataplus)._M_p = pcVar1;
    type->_M_string_length = (size_type)p_Var4;
    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
       p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)value);
  if (iVar2 == 0) {
    std::__shared_ptr<IntegerInstance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<IntegerInstance>,std::__cxx11::string_const&>
              ((__shared_ptr<IntegerInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<IntegerInstance> *)&local_39,in_RDX);
    p_Var5 = p_Stack_30;
    pcVar1 = local_38;
    local_38 = (pointer)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (type->_M_dataplus)._M_p = pcVar1;
    type->_M_string_length = (size_type)p_Var5;
    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
       p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)value);
  if (iVar2 == 0) {
    std::__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<FloatInstance>,std::__cxx11::string_const&>
              ((__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<FloatInstance> *)&local_39,in_RDX);
    p_Var4 = p_Stack_30;
    pcVar1 = local_38;
    local_38 = (pointer)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = pcVar1;
    type->_M_string_length = (size_type)p_Var4;
    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
       p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)value);
  _Var3._M_pi = extraout_RDX;
  if (iVar2 == 0) {
    std::__shared_ptr<StringInstance,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<StringInstance>,std::__cxx11::string_const&>
              ((__shared_ptr<StringInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<StringInstance> *)&local_39,in_RDX);
    p_Var4 = p_Stack_30;
    pcVar1 = local_38;
    local_38 = (pointer)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = pcVar1;
    type->_M_string_length = (size_type)p_Var4;
    _Var3._M_pi = extraout_RDX_00;
    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
       _Var3._M_pi = extraout_RDX_01,
       p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
  sVar6.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar6.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)type;
  return (shared_ptr<Instance>)sVar6.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> get_shared_instance(const std::string& type, const std::string& value) {
    std::shared_ptr<Instance> instance;
    if (type == "Boolean")
        instance = std::make_shared<BooleanInstance>(value);
    if (type == "Character")
        instance = std::make_shared<CharacterInstance>(value);
    if (type == "Integer")
        instance = std::make_shared<IntegerInstance>(value);
    if (type == "Float")
        instance = std::make_shared<FloatInstance>(value);
    if (type == "String")
        instance = std::make_shared<StringInstance>(value);
    return instance;
}